

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O0

void __thiscall
http_response_parsing_smoke01_Test::TestBody(http_response_parsing_smoke01_Test *this)

{
  size_t *text;
  bool bVar1;
  char *message;
  char *in_R9;
  string local_b8;
  AssertHelper local_98;
  Message local_90 [3];
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  http_response response;
  sub_string str;
  http_response_parsing_smoke01_Test *this_local;
  
  join_0x00000010_0x00000000_ =
       sub_string::literal<183ul>
                 ((char (*) [183])
                  "HTTP/1.1 304 Not Modified\r\nDate: Wed, 23 Dec 2015 13:32:04 GMT\r\nServer: Apache/2\r\nETag: \"277f-3e3073913b100\"\r\nExpires: Wed, 23 Dec 2015 19:32:04 GMT\r\nCache-Control: max-age=21600\r\n\r\n"
                 );
  text = &response.headers._M_t._M_impl.super__Rb_tree_header._M_node_count;
  parse_response((http_response *)&gtest_ar_.message_,(sub_string *)text);
  bVar1 = sub_string::empty((sub_string *)text);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_78,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_78,(AssertionResult *)0x1870b9,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0xd1,message);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  http_response::~http_response((http_response *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(http_response_parsing, smoke01)
{
    sub_string str = sub_string::literal(
        "HTTP/1.1 304 Not Modified" "\r\n"
        "Date: Wed, 23 Dec 2015 13:32:04 GMT" "\r\n"
        "Server: Apache/2" "\r\n"
        "ETag: \"277f-3e3073913b100\"" "\r\n"
        "Expires: Wed, 23 Dec 2015 19:32:04 GMT" "\r\n"
        "Cache-Control: max-age=21600" "\r\n"
        "\r\n");
    http_response response = parse_response(str);
    EXPECT_TRUE(str.empty());
}